

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blenders_generic.h
# Opt level: O0

void __thiscall
agge::blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
operator()(blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>
           *this,pixel *pixels,int param_2,int param_3,count_t n,cover_type *covers)

{
  int iVar1;
  byte *pbStack_30;
  int alpha;
  cover_type *covers_local;
  count_t n_local;
  int param_3_local;
  int param_2_local;
  pixel *pixels_local;
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>
  *this_local;
  
  pbStack_30 = covers;
  _param_3_local = pixels;
  for (covers_local._4_4_ = n; covers_local._4_4_ != 0; covers_local._4_4_ = covers_local._4_4_ - 1)
  {
    iVar1 = this->_a * (uint)*pbStack_30;
    if (iVar1 == 0x3fffc0) {
      _param_3_local->components[0] = (this->_color).r;
      _param_3_local->components[1] = (this->_color).g;
      _param_3_local->components[2] = (this->_color).b;
    }
    else {
      _param_3_local->components[0] =
           _param_3_local->components[0] +
           (char)((int)(((uint)(this->_color).r - (uint)_param_3_local->components[0]) * iVar1) >>
                 0x16);
      _param_3_local->components[1] =
           _param_3_local->components[1] +
           (char)((int)(((uint)(this->_color).g - (uint)_param_3_local->components[1]) * iVar1) >>
                 0x16);
      _param_3_local->components[2] =
           _param_3_local->components[2] +
           (char)((int)(((uint)(this->_color).b - (uint)_param_3_local->components[2]) * iVar1) >>
                 0x16);
    }
    _param_3_local = _param_3_local + 1;
    pbStack_30 = pbStack_30 + 1;
  }
  return;
}

Assistant:

inline void blender_solid_color_rgb<PixelT, OrderT>::operator ()(pixel *pixels, int /*x*/, int /*y*/, count_t n,
		const cover_type *covers) const
	{
		for (; n; --n, ++pixels)
		{
			const int alpha = _a * *covers++;

			if (0x3FFFC0 ^ alpha)
			{
				pixels->components[OrderT::R]
					+= static_cast<uint8_t>((_color.r - pixels->components[OrderT::R]) * alpha >> 22);
				pixels->components[OrderT::G]
					+= static_cast<uint8_t>((_color.g - pixels->components[OrderT::G]) * alpha >> 22);
				pixels->components[OrderT::B]
					+= static_cast<uint8_t>((_color.b - pixels->components[OrderT::B]) * alpha >> 22);
			}
			else
			{
				pixels->components[OrderT::R] = _color.r;
				pixels->components[OrderT::G] = _color.g;
				pixels->components[OrderT::B] = _color.b;
			}
		}
	}